

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_4_P::ComputeStiffnessMatrix(ChElementTetraCorot_4_P *this)

{
  ChMatrixDynamic<> *pCVar1;
  pointer psVar2;
  element_type *peVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  element_type *peVar7;
  char *__function;
  long lVar8;
  ActualDstType actualDst_1;
  ChMatrixNM<double,_4,_4> tmp;
  assign_op<double,_double> local_159;
  long local_158 [3];
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_140;
  Matrix<double,_4,_4,_1,_4,_4> local_100;
  
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = 0;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar8 * 4) = *(undefined8 *)((long)&peVar3->pos + lVar8);
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x18);
  peVar3 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar8 = 0;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar8 * 4 + 8) = *(undefined8 *)((long)&peVar3->pos + lVar8);
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x18);
  peVar3 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar8 = 0;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar8 * 4 + 0x10) = *(undefined8 *)((long)&peVar3->pos + lVar8);
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x18);
  peVar3 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar8 = 0;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar8 * 4 + 0x18) = *(undefined8 *)((long)&peVar3->pos + lVar8);
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x18);
  local_140.m_lhs.m_lhs._0_8_ = &local_100;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xc]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xe]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xf]
       = 1.0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&this->mM,(SrcXprType *)&local_140,(assign_op<double,_double> *)local_158);
  uVar4 = (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows;
  if ((0 < (long)uVar4) &&
     (uVar5 = (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols, 0 < (long)uVar5)) {
    pCVar1 = &this->MatrB;
    pdVar6 = (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_data;
    *pdVar6 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[0];
    if ((uVar5 != 1) &&
       (((pdVar6[1] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                      m_storage.m_data.array[4], 2 < uVar5 &&
         (pdVar6[2] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                      m_storage.m_data.array[8], uVar5 != 3)) &&
        (pdVar6[3] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xc], uVar4 != 1)))) {
      pdVar6[uVar5] =
           (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[1];
      pdVar6[uVar5 + 1] =
           (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[5];
      pdVar6[uVar5 + 2] =
           (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[9];
      pdVar6[uVar5 + 3] =
           (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0xd];
      if (2 < uVar4) {
        pdVar6[uVar5 * 2] =
             (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
             m_data.array[2];
        pdVar6[uVar5 * 2 + 1] =
             (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
             m_data.array[6];
        pdVar6[uVar5 * 2 + 2] =
             (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
             m_data.array[10];
        pdVar6[uVar5 * 2 + 3] =
             (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
             m_data.array[0xe];
        peVar7 = (this->Material).
                 super___shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (uVar4 == *(ulong *)(peVar7 + 0x18)) {
          local_140.m_lhs.m_lhs.m_lhs.m_functor.m_other = this->Volume;
          local_140.m_lhs.m_rhs = (RhsNested)(peVar7 + 0x10);
          local_140.m_lhs.m_lhs.m_lhs.m_rows.m_value = uVar5;
          local_140.m_lhs.m_lhs.m_lhs.m_cols.m_value = uVar4;
          local_140.m_lhs.m_lhs.m_rhs.m_matrix = pCVar1;
          local_140.m_rhs = pCVar1;
          if (*(ulong *)(peVar7 + 0x20) == uVar4) {
            Eigen::Matrix<double,-1,-1,1,-1,-1>::
            Matrix<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
                      ((Matrix<double,_1,_1,1,_1,_1> *)local_158,&local_140);
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                      (&this->StiffnessMatrix,(Matrix<double,__1,__1,_1,__1,__1> *)local_158,
                       &local_159);
            if (local_158[0] != 0) {
              free(*(void **)(local_158[0] + -8));
            }
            return;
          }
          __function = 
          "Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
          ;
        }
        else {
          __function = 
          "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
          ;
        }
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementTetraCorot_4_P::ComputeStiffnessMatrix() {
    // M = [ X0_0 X0_1 X0_2 X0_3 ] ^-1
    //     [ 1    1    1    1    ]
    ChMatrixNM<double, 4, 4> tmp;
    tmp.block(0, 0, 3, 1) = nodes[0]->GetPos().eigen();
    tmp.block(0, 1, 3, 1) = nodes[1]->GetPos().eigen();
    tmp.block(0, 2, 3, 1) = nodes[2]->GetPos().eigen();
    tmp.block(0, 3, 3, 1) = nodes[3]->GetPos().eigen();
    tmp.row(3).setConstant(1.0);
    mM = tmp.inverse();

    ////MatrB.Reset(3, 4);
    MatrB(0, 0) = mM(0);
    MatrB(0, 1) = mM(4);
    MatrB(0, 2) = mM(8);
    MatrB(0, 3) = mM(12);
    MatrB(1, 0) = mM(1);
    MatrB(1, 1) = mM(5);
    MatrB(1, 2) = mM(9);
    MatrB(1, 3) = mM(13);
    MatrB(2, 0) = mM(2);
    MatrB(2, 1) = mM(6);
    MatrB(2, 2) = mM(10);
    MatrB(2, 3) = mM(14);

    StiffnessMatrix = Volume * MatrB.transpose() * Material->Get_ConstitutiveMatrix() * MatrB;
}